

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

void __thiscall csguide_webserver::ThreadPool::Shutdown(ThreadPool *this,bool graceful)

{
  int iVar1;
  ostream *poVar2;
  MutexLockGuard guard;
  int i;
  long lVar3;
  
  pthread_mutex_lock((pthread_mutex_t *)this);
  if (this->shutdown_ != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"has shutdown");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  this->shutdown_ = graceful + 1;
  pthread_cond_broadcast((pthread_cond_t *)&(this->condition_).cond_);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  for (lVar3 = 0; lVar3 < this->thread_size_; lVar3 = lVar3 + 1) {
    iVar1 = pthread_join((this->threads_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar3],(void **)0x0);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pthread_join error");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  return;
}

Assistant:

void ThreadPool::Shutdown(bool graceful) {
  {
    MutexLockGuard guard(this->mutex_);
    if (shutdown_) {
      std::cout << "has shutdown" << std::endl;
    }
    shutdown_ = graceful ? graceful_mode : immediate_mode;
      condition_.NotifyAll();
  }
  for (int i = 0; i < thread_size_; i++) {
    if (pthread_join(threads_[i], NULL) != 0) {
      std::cout << "pthread_join error" << std::endl;
    }
  }
}